

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

bool __thiscall
testing::internal::FloatingPoint<double>::AlmostEquals
          (FloatingPoint<double> *this,FloatingPoint<double> *rhs)

{
  long lVar1;
  Bits BVar2;
  long in_FS_OFFSET;
  bool bVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((~(this->u_).bits_ & 0x7ff0000000000000) == 0 && ((this->u_).bits_ & 0xfffffffffffff) != 0)
     || ((~(rhs->u_).bits_ & 0x7ff0000000000000) == 0 && ((rhs->u_).bits_ & 0xfffffffffffff) != 0))
  {
    bVar3 = false;
  }
  else {
    BVar2 = DistanceBetweenSignAndMagnitudeNumbers((Bits *)this,(Bits *)rhs);
    bVar3 = BVar2 < 5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool AlmostEquals(const FloatingPoint& rhs) const {
    // The IEEE standard says that any comparison operation involving
    // a NAN must return false.
    if (is_nan() || rhs.is_nan()) return false;

    return DistanceBetweenSignAndMagnitudeNumbers(u_.bits_, rhs.u_.bits_)
        <= kMaxUlps;
  }